

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86Disassembler.c
# Opt level: O2

void translateRegister(MCInst *mcInst,Reg reg)

{
  MCOperand_CreateReg0(mcInst,(uint)(byte)(&DAT_001ea4e0)[reg]);
  return;
}

Assistant:

static void translateRegister(MCInst *mcInst, Reg reg)
{
#define ENTRY(x) X86_##x,
	uint8_t llvmRegnums[] = {
		ALL_REGS
			0
	};
#undef ENTRY

	uint8_t llvmRegnum = llvmRegnums[reg];
	MCOperand_CreateReg0(mcInst, llvmRegnum);
}